

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcompress.c
# Opt level: O1

int uncompress2mem_from_mem
              (char *inmemptr,size_t inmemsize,char **buffptr,size_t *buffsize,
              _func_void_ptr_void_ptr_size_t *mem_realloc,size_t *filesize,int *status)

{
  int iVar1;
  char *pcVar2;
  char *local_a0;
  undefined4 local_98;
  char *local_88;
  undefined4 local_80;
  size_t local_78;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  
  iVar1 = *status;
  if (iVar1 < 1) {
    local_60 = 0;
    uStack_58 = 0;
    local_50 = 0;
    iVar1 = inflateInit2_(&local_a0,0x1f,"1.2.11",0x70);
    if (iVar1 == 0) {
      local_98 = (undefined4)inmemsize;
      local_88 = *buffptr;
      local_80 = (undefined4)*buffsize;
      local_a0 = inmemptr;
      while ((iVar1 = inflate(&local_a0,0), iVar1 == -5 || (iVar1 == 0))) {
        if (mem_realloc == (_func_void_ptr_void_ptr_size_t *)0x0) goto LAB_00204a0f;
        pcVar2 = (char *)(*mem_realloc)(*buffptr,*buffsize + 0x7080);
        *buffptr = pcVar2;
        if (pcVar2 == (char *)0x0) goto LAB_00204a0f;
        local_80 = 0x7080;
        local_88 = pcVar2 + *buffsize;
        *buffsize = *buffsize + 0x7080;
      }
      if (iVar1 == 1) {
        if (filesize != (size_t *)0x0) {
          *filesize = local_78;
        }
        iVar1 = inflateEnd(&local_a0);
        if (iVar1 == 0) {
          return *status;
        }
        *status = 0x19e;
        goto LAB_00204a27;
      }
LAB_00204a0f:
      inflateEnd(&local_a0);
      *status = 0x19e;
    }
    else {
      *status = 0x19e;
    }
LAB_00204a27:
    iVar1 = 0x19e;
  }
  return iVar1;
}

Assistant:

int uncompress2mem_from_mem(                                                
             char *inmemptr,     /* I - memory pointer to compressed bytes */
             size_t inmemsize,   /* I - size of input compressed file      */
             char **buffptr,   /* IO - memory pointer                      */
             size_t *buffsize,   /* IO - size of buffer, in bytes           */
             void *(*mem_realloc)(void *p, size_t newsize), /* function     */
             size_t *filesize,   /* O - size of file, in bytes              */
             int *status)        /* IO - error status                       */

/*
  Uncompress the file in memory into memory.  Fill whatever amount of memory has
  already been allocated, then realloc more memory, using the supplied
  input function, if necessary.
*/
{
    int err; 
    z_stream d_stream;   /* decompression stream */

    if (*status > 0) 
        return(*status); 

    d_stream.zalloc = (alloc_func)0;
    d_stream.zfree = (free_func)0;
    d_stream.opaque = (voidpf)0;

    /* Initialize the decompression.  The argument (15+16) tells the
       decompressor that we are to use the gzip algorithm */
    err = inflateInit2(&d_stream, (15+16));
    if (err != Z_OK) return(*status = 414);

    d_stream.next_in = (unsigned char*)inmemptr;
    d_stream.avail_in = inmemsize;

    d_stream.next_out = (unsigned char*) *buffptr;
    d_stream.avail_out = *buffsize;

    for (;;) {
        /* uncompress as much of the input as will fit in the output */
        err = inflate(&d_stream, Z_NO_FLUSH);

        if (err == Z_STREAM_END) { /* We reached the end of the input */
	    break; 
        } else if (err == Z_OK || err == Z_BUF_ERROR) { /* need more space in output buffer */
	    /* Z_BUF_ERROR means need more input data to make progress */

            if (mem_realloc) {   
                *buffptr = mem_realloc(*buffptr,*buffsize + BUFFINCR);
                if (*buffptr == NULL){
                    inflateEnd(&d_stream);
                    return(*status = 414);  /* memory allocation failed */
                }

                d_stream.avail_out = BUFFINCR;
                d_stream.next_out = (unsigned char*) (*buffptr + *buffsize);
                *buffsize = *buffsize + BUFFINCR;

            } else  { /* error: no realloc function available */
                inflateEnd(&d_stream);
                return(*status = 414);
            }
        } else {  /* some other error */
            inflateEnd(&d_stream);
            return(*status = 414);
        }
    }

    /* Set the output file size to be the total output data */
    if (filesize) *filesize = d_stream.total_out;

    /* End the decompression */
    err = inflateEnd(&d_stream);

    if (err != Z_OK) return(*status = 414);
    
    return(*status);
}